

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTestPackages.cpp
# Opt level: O3

int __thiscall gl3cts::GL33TestPackage::init(GL33TestPackage *this,EVP_PKEY_CTX *ctx)

{
  PackageContext *pPVar1;
  int extraout_EAX;
  TestNode *pTVar2;
  
  GL32TestPackage::init(&this->super_GL32TestPackage,ctx);
  pTVar2 = (TestNode *)operator_new(0x78);
  pPVar1 = (this->super_GL32TestPackage).super_GL31TestPackage.super_GL30TestPackage.
           super_TestPackage.m_packageCtx;
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,(pPVar1->m_context).m_testCtx,"shaders",
             "Shading Language Tests");
  pTVar2[1]._vptr_TestNode = (_func_int **)pPVar1;
  pTVar2->_vptr_TestNode = (_func_int **)&PTR__TestCase_020c9750;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  ::glcts::PipelineStatisticsQueryTests::PipelineStatisticsQueryTests
            ((PipelineStatisticsQueryTests *)pTVar2,
             &((this->super_GL32TestPackage).super_GL31TestPackage.super_GL30TestPackage.
               super_TestPackage.m_packageCtx)->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  ::glcts::CullDistance::Tests::Tests
            ((Tests *)pTVar2,
             &((this->super_GL32TestPackage).super_GL31TestPackage.super_GL30TestPackage.
               super_TestPackage.m_packageCtx)->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x78);
  TextureSwizzleTests::TextureSwizzleTests
            ((TextureSwizzleTests *)pTVar2,
             &((this->super_GL32TestPackage).super_GL31TestPackage.super_GL30TestPackage.
               super_TestPackage.m_packageCtx)->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  return extraout_EAX;
}

Assistant:

void GL33TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	GL32TestPackage::init();

	try
	{
		addChild(new GL33ShaderTests(getContext()));
		addChild(new glcts::PipelineStatisticsQueryTests(getContext()));
		addChild(new glcts::CullDistance::Tests(getContext()));
		addChild(new gl3cts::TextureSwizzleTests(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}